

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,slang::parsing::Token>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,slang::detail::hashing::StackAllocator<std::pair<slang::parsing::TokenKind_const,slang::parsing::Token>,96ul,16ul>>
::nosize_unchecked_emplace_at<std::pair<slang::parsing::TokenKind&&,slang::parsing::Token&&>>
          (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_slang::parsing::Token>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::parsing::TokenKind,_void>,_std::equal_to<slang::parsing::TokenKind>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>,_96UL,_16UL>_>
           *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<slang::parsing::TokenKind_&&,_slang::parsing::Token_&&> *args)

{
  int iVar1;
  uint n_;
  size_t sVar2;
  group_type *pgVar3;
  value_type *pvVar4;
  size_t in_RCX;
  long in_RDX;
  group15<boost::unordered::detail::foa::plain_integral> *in_RSI;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_slang::parsing::Token>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::parsing::TokenKind,_void>,_std::equal_to<slang::parsing::TokenKind>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>,_96UL,_16UL>_>
  *in_RDI;
  value_type *p;
  uint n;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  element_type *in_stack_ffffffffffffff88;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_slang::parsing::Token>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::parsing::TokenKind,_void>,_std::equal_to<slang::parsing::TokenKind>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>,_96UL,_16UL>_>
  *pos_00;
  pow2_quadratic_prober local_38 [2];
  long local_10;
  
  pos_00 = in_RDI;
  local_10 = in_RDX;
  pow2_quadratic_prober::pow2_quadratic_prober(local_38,in_RCX);
  while( true ) {
    sVar2 = pow2_quadratic_prober::get(local_38);
    pgVar3 = table_arrays<std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>,_96UL,_16UL>_>
             ::groups((table_arrays<std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>,_96UL,_16UL>_>
                       *)0x5bcc29);
    iVar1 = group15<boost::unordered::detail::foa::plain_integral>::match_available
                      ((group15<boost::unordered::detail::foa::plain_integral> *)
                       in_stack_ffffffffffffff88);
    if (iVar1 != 0) break;
    group15<boost::unordered::detail::foa::plain_integral>::mark_overflow
              ((group15<boost::unordered::detail::foa::plain_integral> *)in_RDI,
               (size_t)in_stack_ffffffffffffff88);
    pow2_quadratic_prober::next(local_38,*(size_t *)(local_10 + 8));
  }
  n_ = unchecked_countr_zero(0);
  pvVar4 = table_arrays<std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>,_96UL,_16UL>_>
           ::elements((table_arrays<std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>,_96UL,_16UL>_>
                       *)0x5bcc66);
  construct_element<std::pair<slang::parsing::TokenKind&&,slang::parsing::Token&&>>
            (in_RDI,in_stack_ffffffffffffff88,
             (pair<slang::parsing::TokenKind_&&,_slang::parsing::Token_&&> *)0x5bcc97);
  group15<boost::unordered::detail::foa::plain_integral>::set(in_RSI,(size_t)pos_00,(size_t)in_RDI);
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>_>
  ::table_locator((table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>_>
                   *)in_RDI,pgVar3 + sVar2,n_,pvVar4 + sVar2 * 0xf + (ulong)n_);
  return (locator *)pos_00;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }